

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorBits.c
# Opt level: O2

void InsertVars(Cube *pC,int *pVars,int nVarsIn,int *pVarValues)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  
  if ((0 < nVarsIn) && (nVarsIn <= g_CoverInfo.nVarsIn)) {
    uVar4 = 0;
    while( true ) {
      if ((uint)nVarsIn == uVar4) {
        return;
      }
      iVar1 = pVars[uVar4];
      if ((iVar1 < 0) || (g_CoverInfo.nVarsIn <= iVar1)) break;
      if (2 < pVarValues[uVar4] - 1U) {
        __assert_fail("pVarValues[i] == VAR_NEG || pVarValues[i] == VAR_POS || pVarValues[i] == VAR_ABS"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/exor/exorBits.c"
                      ,0x181,"void InsertVars(Cube *, int *, int, int *)");
      }
      iVar3 = iVar1 * 2 >> 5;
      bVar2 = (byte)(iVar1 * 2);
      pC->pCubeDataIn[iVar3] =
           pVarValues[uVar4] << (bVar2 & 0x1f) | ~(3 << (bVar2 & 0x1f)) & pC->pCubeDataIn[iVar3];
      uVar4 = uVar4 + 1;
    }
    __assert_fail("pVars[i] >= 0 && pVars[i] < g_CoverInfo.nVarsIn",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/exor/exorBits.c"
                  ,0x180,"void InsertVars(Cube *, int *, int, int *)");
  }
  __assert_fail("nVarsIn > 0 && nVarsIn <= g_CoverInfo.nVarsIn",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/exor/exorBits.c"
                ,0x17d,"void InsertVars(Cube *, int *, int, int *)");
}

Assistant:

void InsertVars( Cube * pC, int * pVars, int nVarsIn, int * pVarValues )
// corrects the given number of variables (nVarsIn) in pC->pCubeDataIn[]
// variable numbers are given in pVarNumbers[], their values are in pVarValues[]
// arrays pVarNumbers[] and pVarValues[] are provided by the user
{
    int GlobalBit;
    int LocalWord;
    int LocalBit;
    int i;
    assert( nVarsIn > 0 && nVarsIn <= g_CoverInfo.nVarsIn );
    for ( i = 0; i < nVarsIn; i++ )
    {
        assert( pVars[i] >= 0 && pVars[i] < g_CoverInfo.nVarsIn );
        assert( pVarValues[i] == VAR_NEG || pVarValues[i] == VAR_POS || pVarValues[i] == VAR_ABS );
        GlobalBit = (pVars[i]<<1);
        LocalWord = VarWord(GlobalBit);
        LocalBit  = VarBit(GlobalBit);

        // correct this variables
        pC->pCubeDataIn[LocalWord] = ((pC->pCubeDataIn[LocalWord]&(~(3<<LocalBit)))|(pVarValues[i]<<LocalBit));
    }
}